

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O0

void test_dual_storage_with_tuple_init_state_mutation(void)

{
  bool bVar1;
  reference_type pDVar2;
  markable<mark_interval,_ak_toolkit::markable_ns::order_none> local_44;
  markable<mark_interval,_ak_toolkit::markable_ns::order_none> local_3c;
  markable<mark_interval,_ak_toolkit::markable_ns::order_none> local_34;
  opt_interval o2;
  markable<mark_interval,_ak_toolkit::markable_ns::order_none> local_20;
  opt_interval o1;
  DateInterval local_10;
  DateInterval i12;
  
  reset_Interval_count();
  Date::Date(&o1._storage.value_._value._last,1);
  Date::Date((Date *)&o1,2);
  DateInterval::DateInterval(&local_10,&o1._storage.value_._value._last,(Date *)&o1);
  bVar1 = count_Interval_value_copy_move_dtror(1,0,0,0);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 0, 0, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x394,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::markable
            (&local_20);
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::markable
            (&local_34,&local_10);
  bVar1 = count_Interval_value_copy_move_dtror(1,1,0,0);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 1, 0, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x397,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  bVar1 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::
          has_value(&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!o1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x399,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  bVar1 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::
          has_value(&local_34);
  if (!bVar1) {
    __assert_fail("o2.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x39a,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::markable
            (&local_3c,&local_10);
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::operator=
            (&local_20,&local_3c);
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::~markable
            (&local_3c);
  bVar1 = count_Interval_value_copy_move_dtror(1,2,1,1);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 1, 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x39d,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::markable
            (&local_44);
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::operator=
            (&local_34,&local_44);
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::~markable
            (&local_44);
  bVar1 = count_Interval_value_copy_move_dtror(1,2,1,2);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 1, 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x39f,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  bVar1 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::
          has_value(&local_20);
  if (!bVar1) {
    __assert_fail("o1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a1,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  pDVar2 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::
           value(&local_20);
  bVar1 = operator==(pDVar2,&local_10);
  if (!bVar1) {
    __assert_fail("o1.value() == i12",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a2,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  bVar1 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::
          has_value(&local_34);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!o2.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a3,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  ak_toolkit::markable_ns::swap(&local_20,&local_34);
  bVar1 = count_Interval_value_copy_move_dtror(1,2,2,3);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 2, 3)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a6,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  bVar1 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::
          has_value(&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!o1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a8,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  bVar1 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::
          has_value(&local_34);
  if (!bVar1) {
    __assert_fail("o2.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a9,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  pDVar2 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::
           value(&local_34);
  bVar1 = operator==(pDVar2,&local_10);
  if (!bVar1) {
    __assert_fail("o2.value() == i12",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3aa,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::~markable
            (&local_34);
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::~markable
            (&local_20);
  DateInterval::~DateInterval(&local_10);
  bVar1 = count_Interval_value_copy_move_dtror(1,2,2,5);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 2, 5)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3ac,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  return;
}

Assistant:

void test_dual_storage_with_tuple_init_state_mutation()
{
  reset_Interval_count();
  {
    typedef markable<mark_interval> opt_interval;
    DateInterval i12 {Date{1}, Date{2}};
    assert (count_Interval_value_copy_move_dtror(1, 0, 0, 0));

    opt_interval o1 {}, o2 {i12};
    assert (count_Interval_value_copy_move_dtror(1, 1, 0, 0));

    assert (!o1.has_value());
    assert (o2.has_value());

    o1 = opt_interval{i12};
    assert (count_Interval_value_copy_move_dtror(1, 2, 1, 1));
    o2 = {};
    assert (count_Interval_value_copy_move_dtror(1, 2, 1, 2));

    assert (o1.has_value());
    assert (o1.value() == i12);
    assert (!o2.has_value());

    swap (o1, o2);
    assert (count_Interval_value_copy_move_dtror(1, 2, 2, 3));

    assert (!o1.has_value());
    assert (o2.has_value());
    assert (o2.value() == i12);
  }
  assert (count_Interval_value_copy_move_dtror(1, 2, 2, 5));
}